

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2ii(char *cval,long *ival,int *status)

{
  int *piVar1;
  long lVar2;
  int *in_RDX;
  long *in_RSI;
  char *in_RDI;
  char msg [81];
  char *loc;
  char acStack_88 [96];
  char *local_28;
  int *local_20;
  long *local_18;
  char *local_10;
  int local_4;
  
  if (*in_RDX < 1) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    piVar1 = __errno_location();
    *piVar1 = 0;
    *local_18 = 0;
    lVar2 = strtol(local_10,&local_28,10);
    *local_18 = lVar2;
    if ((*local_28 != '\0') && (*local_28 != ' ')) {
      *local_20 = 0x197;
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0x22) {
      strcpy(acStack_88,"Range Error in ffc2ii converting string to long int: ");
      strncat(acStack_88,local_10,0x19);
      ffpmsg((char *)0x16ad51);
      *local_20 = 0x19c;
      piVar1 = __errno_location();
      *piVar1 = 0;
    }
    local_4 = *local_20;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffc2ii(const char *cval,  /* I - string representation of the value */
          long *ival,         /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert null-terminated formatted string to an integer value
*/
{
    char *loc, msg[81];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    errno = 0;
    *ival = 0;
    *ival = strtol(cval, &loc, 10);  /* read the string as an integer */

    /* check for read error, or junk following the integer */
    if (*loc != '\0' && *loc != ' ' ) 
        *status = BAD_C2I;

    if (errno == ERANGE)
    {
        strcpy(msg,"Range Error in ffc2ii converting string to long int: ");
        strncat(msg,cval,25);
        ffpmsg(msg);

        *status = NUM_OVERFLOW;
        errno = 0;
    }

    return(*status);
}